

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

void __thiscall
ncnn::Deconvolution::cut_padding
          (Deconvolution *this,Mat *top_blob_bordered,Mat *top_blob,Option *opt)

{
  int *piVar1;
  undefined8 in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int hcut;
  int wcut;
  int iVar2;
  int left;
  int bottom;
  int top;
  Option *in_stack_ffffffffffffffd0;
  
  left = (int)((ulong)in_RCX >> 0x20);
  top = (int)((ulong)in_RDX >> 0x20);
  iVar2 = (int)in_RCX;
  bottom = (int)in_RDX;
  if ((((*(int *)((long)&in_RDI[3].elemsize + 4) < 1) && (in_RDI[3].elempack < 1)) &&
      (*(int *)&in_RDI[3].field_0x1c < 1)) && (*(int *)&in_RDI[3].allocator < 1)) {
    if ((in_RDI[3].w < 1) || (in_RDI[3].h < 1)) {
      if (in_RDX != in_RSI) {
        if (in_RSI->refcount != (int *)0x0) {
          LOCK();
          *in_RSI->refcount = *in_RSI->refcount + 1;
          UNLOCK();
        }
        if (in_RDX->refcount != (int *)0x0) {
          piVar1 = in_RDX->refcount;
          LOCK();
          iVar2 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (in_RDX->allocator == (Allocator *)0x0) {
              if (in_RDX->data != (void *)0x0) {
                free(in_RDX->data);
              }
            }
            else {
              (**(code **)(*(long *)in_RDX->allocator + 0x18))(in_RDX->allocator,in_RDX->data);
            }
          }
        }
        in_RDX->data = (void *)0x0;
        in_RDX->elemsize = 0;
        in_RDX->elempack = 0;
        in_RDX->dims = 0;
        in_RDX->w = 0;
        in_RDX->h = 0;
        in_RDX->d = 0;
        in_RDX->c = 0;
        in_RDX->cstep = 0;
        in_RDX->refcount = (int *)0x0;
        in_RDX->data = in_RSI->data;
        in_RDX->refcount = in_RSI->refcount;
        in_RDX->elemsize = in_RSI->elemsize;
        in_RDX->elempack = in_RSI->elempack;
        in_RDX->allocator = in_RSI->allocator;
        in_RDX->dims = in_RSI->dims;
        in_RDX->w = in_RSI->w;
        in_RDX->h = in_RSI->h;
        in_RDX->d = in_RSI->d;
        in_RDX->c = in_RSI->c;
        in_RDX->cstep = in_RSI->cstep;
      }
    }
    else if (((*(int *)((long)&in_RDI[3].elemsize + 4) == -0xe9) || (in_RDI[3].elempack == -0xe9))
            || ((*(int *)&in_RDI[3].field_0x1c == -0xe9 || (*(int *)&in_RDI[3].allocator == -0xe9)))
            ) {
      copy_cut_border(in_RDI,in_RSI,top,bottom,left,iVar2,in_stack_ffffffffffffffd0);
    }
    else if ((((*(int *)((long)&in_RDI[3].elemsize + 4) == -0xea) || (in_RDI[3].elempack == -0xea))
             || (*(int *)&in_RDI[3].field_0x1c == -0xea)) || (*(int *)&in_RDI[3].allocator == -0xea)
            ) {
      copy_cut_border(in_RDI,in_RSI,top,bottom,left,iVar2,in_stack_ffffffffffffffd0);
    }
  }
  else {
    copy_cut_border(in_RDI,in_RSI,top,bottom,left,iVar2,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void Deconvolution::cut_padding(const Mat& top_blob_bordered, Mat& top_blob, const Option& opt) const
{
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
    }
    else if (output_w > 0 && output_h > 0)
    {
        int wcut = top_blob_bordered.w - output_w;
        int hcut = top_blob_bordered.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
    }
    else
    {
        top_blob = top_blob_bordered;
    }
}